

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O0

void __thiscall Balk::solve_balk(Balk *this)

{
  bool bVar1;
  int iVar2;
  __shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  __shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  reference psVar6;
  vector<double,_std::allocator<double>_> local_e0;
  __shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_c8;
  shared_ptr<Term> *el_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_> *__range1_1;
  const_iterator local_a0;
  __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
  local_98;
  shared_ptr<Term> *local_90;
  shared_ptr<Term> *local_88;
  const_iterator local_80;
  __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
  local_68;
  __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
  local_60;
  iterator it;
  shared_ptr<Term> last;
  shared_ptr<Term> first;
  shared_ptr<Term> *el;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_> *__range1;
  size_t unknown_num;
  Balk *this_local;
  
  __end1 = std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::begin
                     (&this->terms);
  el = (shared_ptr<Term> *)
       std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::end
                 (&this->terms);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                                     *)&el), bVar1) {
    this_00 = (__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
              ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this_00);
    bVar1 = Term::isUnknown(peVar3);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (this_00);
      iVar2 = Term::getShift(peVar3);
      if (iVar2 != 0) {
        peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        Term::getShift(peVar3);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_ptr<Term>::shared_ptr
            ((shared_ptr<Term> *)
             &last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount,(nullptr_t)0x0);
  std::shared_ptr<Term>::shared_ptr((shared_ptr<Term> *)&it,(nullptr_t)0x0);
  local_60._M_current =
       (shared_ptr<Term> *)
       std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::begin
                 (&this->terms);
  while( true ) {
    local_68._M_current =
         (shared_ptr<Term> *)
         std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::end
                   (&this->terms);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_68);
    if (!bVar1) break;
    p_Var4 = &__gnu_cxx::
              __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
              ::operator->(&local_60)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>;
    peVar5 = std::__shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>::get(p_Var4);
    iVar2 = Term::getShift(peVar5);
    if (iVar2 == 0) {
      p_Var4 = &__gnu_cxx::
                __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                ::operator->(&local_60)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>;
      peVar5 = std::__shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>::get(p_Var4);
      if ((peVar5->initial_variable & 1U) == 0) {
        psVar6 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                 ::operator*(&local_60);
        std::shared_ptr<Term>::operator=
                  ((shared_ptr<Term> *)
                   &last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount,psVar6);
        break;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
    ::operator++(&local_60);
  }
  bVar1 = std::operator==((shared_ptr<Term> *)
                          &last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                          (nullptr_t)0x0);
  if (bVar1) {
    func(this,2,0.0);
    func(this,3,0.0);
  }
  else {
    peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    (*peVar3->_vptr_Term[3])(peVar3,this);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Term>const*,std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>>
    ::__normal_iterator<std::shared_ptr<Term>*>
              ((__normal_iterator<std::shared_ptr<Term>const*,std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>>
                *)&local_80,&local_60);
    local_88 = (shared_ptr<Term> *)
               std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::erase
                         (&this->terms,local_80);
  }
  local_90 = (shared_ptr<Term> *)
             std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::begin
                       (&this->terms);
  local_60._M_current = local_90;
  do {
    local_98._M_current =
         (shared_ptr<Term> *)
         std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::end
                   (&this->terms);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_98);
    if (!bVar1) {
LAB_00105ef4:
      bVar1 = std::operator==((shared_ptr<Term> *)&it,(nullptr_t)0x0);
      if (bVar1) {
        func(this,2,this->segment_length * (double)this->balk_size);
        func(this,3,this->segment_length * (double)this->balk_size);
      }
      else {
        peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            &it);
        (*peVar3->_vptr_Term[3])(peVar3,this);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Term>const*,std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>>
        ::__normal_iterator<std::shared_ptr<Term>*>
                  ((__normal_iterator<std::shared_ptr<Term>const*,std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>>
                    *)&local_a0,&local_60);
        std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::erase
                  (&this->terms,local_a0);
      }
      __end1_1 = std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::begin
                           (&this->terms);
      el_1 = (shared_ptr<Term> *)
             std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::end
                       (&this->terms);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                                 *)&el_1), bVar1) {
        local_c8 = (__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   __gnu_cxx::
                   __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                   ::operator*(&__end1_1);
        peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_c8);
        bVar1 = Term::isUnknown(peVar3);
        if (bVar1) {
          peVar3 = std::__shared_ptr_access<Term,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_c8);
          (*peVar3->_vptr_Term[3])(peVar3,this);
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
        ::operator++(&__end1_1);
      }
      lu::solve(&local_e0,&this->A,&this->b);
      std::vector<double,_std::allocator<double>_>::operator=(&this->x,&local_e0);
      std::vector<double,_std::allocator<double>_>::~vector(&local_e0);
      std::shared_ptr<Term>::~shared_ptr((shared_ptr<Term> *)&it);
      std::shared_ptr<Term>::~shared_ptr
                ((shared_ptr<Term> *)
                 &last.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    p_Var4 = &__gnu_cxx::
              __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
              ::operator->(&local_60)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>;
    peVar5 = std::__shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>::get(p_Var4);
    iVar2 = Term::getShift(peVar5);
    if (iVar2 == this->balk_size) {
      p_Var4 = &__gnu_cxx::
                __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                ::operator->(&local_60)->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>;
      peVar5 = std::__shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>::get(p_Var4);
      if ((peVar5->initial_variable & 1U) == 0) {
        psVar6 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
                 ::operator*(&local_60);
        std::shared_ptr<Term>::operator=((shared_ptr<Term> *)&it,psVar6);
        goto LAB_00105ef4;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Term>_*,_std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>_>
    ::operator++(&local_60);
  } while( true );
}

Assistant:

void Balk::solve_balk()
{
    // Count a number of unknown elements. Init with 4 because of initial variables.
    size_t unknown_num = 4;
    for (const auto &el : terms)
    {
        unknown_num += ((el->isUnknown()) && (el->getShift() != 0) && (el->getShift() != balk_size));
    }

    std::shared_ptr<Term> first = nullptr;
    std::shared_ptr<Term> last = nullptr;
    auto it = terms.begin();
    for (; it != terms.end(); ++it)
    {
        if ((it->get()->getShift() == 0) && !(it->get()->initial_variable))
        {
            first = *it;
            break;
        }
    }
    if (first == nullptr)
    { // Free begin
        func(2, 0);
        func(3, 0);
    }
    else
    {
        first->addAnEquation(*this);
        terms.erase(it);
    }

    it = terms.begin();
    for (; it != terms.end(); ++it)
    {
        if ((it->get()->getShift() == balk_size) && !(it->get()->initial_variable))
        {
            last = *it;
            break;
        }
    }
    if (last == nullptr)
    { // Free end
        func(2, segment_length * balk_size);
        func(3, segment_length * balk_size);
    }
    else
    {
        last->addAnEquation(*this);
        terms.erase(it);
    }

    for (const auto &el : terms)
    {
        if (el->isUnknown())
        {
            el->addAnEquation(*this);
        }
    }

    x = lu::solve(A, b);
}